

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::kill_all(ThreadSafeDeque<csv::CSVRow> *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->_lock;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->_is_waitable = false;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void kill_all() {
                std::unique_lock<std::mutex> lock{ this->_lock };
                this->_is_waitable = false;
                this->_cond.notify_all();
            }